

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O2

Any __thiscall amrex::MLLinOp::AnyMakeCoarseMG(MLLinOp *this,int amrlev,int mglev,IntVect *ng)

{
  long lVar1;
  int ncomp;
  undefined4 in_register_00000034;
  long *plVar2;
  IntVect *in_R8;
  long lVar3;
  IntVect ratio;
  BoxArray cba;
  undefined1 *local_258;
  int local_250;
  FabFactory<amrex::FArrayBox> local_248;
  MFInfo local_240;
  BoxArray local_218;
  MultiFab local_1b0;
  
  plVar2 = (long *)CONCAT44(in_register_00000034,amrlev);
  lVar3 = (long)(int)ng;
  BoxArray::BoxArray(&local_218,
                     (BoxArray *)(lVar3 * 0x68 + *(long *)(plVar2[0x16] + (long)mglev * 0x18)));
  if (mglev < 1) {
    local_250 = *(int *)(plVar2[0x10] + 8 + lVar3 * 0xc);
    local_258 = *(undefined1 **)(plVar2[0x10] + lVar3 * 0xc);
  }
  else {
    local_258 = &DAT_200000002;
    local_250 = 2;
  }
  BoxArray::coarsen(&local_218,(IntVect *)&local_258);
  BoxArray::convert(&local_218,(IntVect *)(plVar2 + 0xe));
  lVar1 = *(long *)(plVar2[0x19] + (long)mglev * 0x18);
  ncomp = (**(code **)(*plVar2 + 0x28))(plVar2);
  local_240.alloc = true;
  local_240._1_7_ = 0;
  local_240.arena = (Arena *)0x0;
  local_240.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248._vptr_FabFactory = (_func_int **)&PTR__FabFactory_006d8928;
  MultiFab::MultiFab(&local_1b0,&local_218,(DistributionMapping *)(lVar1 + lVar3 * 0x10),ncomp,in_R8
                     ,&local_240,&local_248);
  Any::Any<amrex::MultiFab>((Any *)this,&local_1b0);
  MultiFab::~MultiFab(&local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_240.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  BoxArray::~BoxArray(&local_218);
  return (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)
         (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)this;
}

Assistant:

Any
MLLinOp::AnyMakeCoarseMG (int amrlev, int mglev, IntVect const& ng) const
{
    BoxArray cba = m_grids[amrlev][mglev];
    IntVect ratio = (amrlev > 0) ? IntVect(2) : mg_coarsen_ratio_vec[mglev];
    cba.coarsen(ratio);
    cba.convert(m_ixtype);
    return Any(MultiFab(cba, m_dmap[amrlev][mglev], getNComp(), ng));
}